

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

pair<const_unsigned_char_*,_long>
duckdb_snappy::DecompressBranchless<unsigned_long>
          (uint8_t *ip,uint8_t *ip_limit,ptrdiff_t op,unsigned_long op_base,
          ptrdiff_t op_limit_min_slop)

{
  bool bVar1;
  uint32_t uVar2;
  const_reference pvVar3;
  ulong uVar4;
  size_t tag_type_00;
  ulong length;
  long lVar5;
  long lVar6;
  array<short,_256UL> *ptr;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  array<short,_256UL> *in_RDI;
  long in_R8;
  void *from;
  ptrdiff_t delta;
  ptrdiff_t delta_1;
  ptrdiff_t len_min_offset;
  ptrdiff_t extracted;
  size_t len;
  size_t tag_type;
  uint32_t next;
  ptrdiff_t len_minus_offset;
  uint8_t *old_ip;
  int i;
  size_t tag;
  uint8_t *ip_limit_min_slop;
  size_t deferred_length;
  void *deferred_src;
  uint8_t safe_source [64];
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  array<short,_256UL> *in_stack_ffffffffffffff00;
  byte local_f1;
  int local_9c;
  ulong local_98;
  array<short,_256UL> *local_90;
  size_t local_88;
  void *local_80;
  uint8_t local_78 [64];
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  array<short,_256UL> *local_18;
  pair<const_unsigned_char_*,_long> local_10;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  ClearDeferred(&local_80,&local_88,local_78);
  local_38 = local_38 + -0x40;
  if ((0x82 < local_20 - (long)local_18) && (local_28 < local_38)) {
    local_90 = (array<short,_256UL> *)(local_20 + -0x81);
    local_98 = (ulong)(byte)local_18->_M_elems[0];
    local_18 = (array<short,_256UL> *)((long)local_18->_M_elems + 1);
    do {
      for (local_9c = 0; ptr = local_18, local_9c < 2; local_9c = local_9c + 1) {
        pvVar3 = std::array<short,_256UL>::operator[]
                           (in_stack_ffffffffffffff00,
                            CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        uVar4 = (ulong)*pvVar3;
        tag_type_00 = AdvanceToNextTagX86Optimized((uint8_t **)&local_18,&local_98);
        uVar2 = LittleEndian::Load32(ptr);
        length = uVar4 & 0xff;
        uVar2 = ExtractOffset(uVar2,tag_type_00);
        lVar5 = uVar4 - uVar2;
        if ((long)(ulong)uVar2 < (long)uVar4) {
          if ((uVar4 & 0x80) != 0) goto LAB_007463c4;
          lVar6 = local_28 + local_88;
          MemCopy64(local_30 + local_28,local_80,local_88);
          local_28 = local_88 + local_28;
          ClearDeferred(&local_80,&local_88,local_78);
          local_f1 = 1;
          if (-1 < (long)((lVar6 + lVar5) - length)) {
            bVar1 = Copy64BytesWithPatternExtension(local_30 + local_28,length - lVar5);
            local_f1 = bVar1 ^ 0xff;
          }
          if ((local_f1 & 1) != 0) goto LAB_007463c4;
          local_28 = length + local_28;
        }
        else {
          lVar5 = (local_28 + local_88 + lVar5) - length;
          if (lVar5 < 0) {
            if (tag_type_00 != 0) goto LAB_007463c4;
            MemCopy64(local_30 + local_28,local_80,local_88);
            local_28 = local_88 + local_28;
            DeferMemCopy(&local_80,&local_88,ptr,length);
          }
          else {
            if (tag_type_00 != 0) {
              ptr = (array<short,_256UL> *)(local_30 + lVar5);
            }
            in_stack_ffffffffffffff00 = ptr;
            MemCopy64(local_30 + local_28,local_80,local_88);
            local_28 = local_88 + local_28;
            DeferMemCopy(&local_80,&local_88,ptr,length);
          }
        }
      }
      in_stack_fffffffffffffeff = local_18 < local_90 && (long)(local_28 + local_88) < local_38;
    } while ((bool)in_stack_fffffffffffffeff);
LAB_007463c4:
    local_18 = (array<short,_256UL> *)((long)ptr[-1]._M_elems + 0x1ff);
  }
  if (local_88 != 0) {
    MemCopy64(local_30 + local_28,local_80,local_88);
    local_28 = local_88 + local_28;
    ClearDeferred(&local_80,&local_88,local_78);
  }
  std::pair<const_unsigned_char_*,_long>::pair<const_unsigned_char_*&,_long_&,_true>
            (&local_10,(uchar **)&local_18,&local_28);
  return local_10;
}

Assistant:

std::pair<const uint8_t*, ptrdiff_t> DecompressBranchless(
    const uint8_t* ip, const uint8_t* ip_limit, ptrdiff_t op, T op_base,
    ptrdiff_t op_limit_min_slop) {
  // If deferred_src is invalid point it here.
  uint8_t safe_source[64];
  const void* deferred_src;
  size_t deferred_length;
  ClearDeferred(&deferred_src, &deferred_length, safe_source);

  // We unroll the inner loop twice so we need twice the spare room.
  op_limit_min_slop -= kSlopBytes;
  if (2 * (kSlopBytes + 1) < ip_limit - ip && op < op_limit_min_slop) {
    const uint8_t* const ip_limit_min_slop = ip_limit - 2 * kSlopBytes - 1;
    ip++;
    // ip points just past the tag and we are touching at maximum kSlopBytes
    // in an iteration.
    size_t tag = ip[-1];
#if defined(__clang__) && defined(__aarch64__)
    // Workaround for https://bugs.llvm.org/show_bug.cgi?id=51317
    // when loading 1 byte, clang for aarch64 doesn't realize that it(ldrb)
    // comes with free zero-extension, so clang generates another
    // 'and xn, xm, 0xff' before it use that as the offset. This 'and' is
    // redundant and can be removed by adding this dummy asm, which gives
    // clang a hint that we're doing the zero-extension at the load.
    asm("" ::"r"(tag));
#endif
    do {
      // The throughput is limited by instructions, unrolling the inner loop
      // twice reduces the amount of instructions checking limits and also
      // leads to reduced mov's.

      SNAPPY_PREFETCH(ip + 128);
      for (int i = 0; i < 2; i++) {
        const uint8_t* old_ip = ip;
        assert(tag == ip[-1]);
        // For literals tag_type = 0, hence we will always obtain 0 from
        // ExtractLowBytes. For literals offset will thus be kLiteralOffset.
        ptrdiff_t len_minus_offset = kLengthMinusOffset[tag];
        uint32_t next;
#if defined(__aarch64__)
        size_t tag_type = AdvanceToNextTagARMOptimized(&ip, &tag);
        // We never need more than 16 bits. Doing a Load16 allows the compiler
        // to elide the masking operation in ExtractOffset.
        next = LittleEndian::Load16(old_ip);
#else
        size_t tag_type = AdvanceToNextTagX86Optimized(&ip, &tag);
        next = LittleEndian::Load32(old_ip);
#endif
        size_t len = len_minus_offset & 0xFF;
        ptrdiff_t extracted = ExtractOffset(next, tag_type);
        ptrdiff_t len_min_offset = len_minus_offset - extracted;
        if (SNAPPY_PREDICT_FALSE(len_minus_offset > extracted)) {
          if (SNAPPY_PREDICT_FALSE(len & 0x80)) {
            // Exceptional case (long literal or copy 4).
            // Actually doing the copy here is negatively impacting the main
            // loop due to compiler incorrectly allocating a register for
            // this fallback. Hence we just break.
          break_loop:
            ip = old_ip;
            goto exit;
          }
          // Only copy-1 or copy-2 tags can get here.
          assert(tag_type == 1 || tag_type == 2);
          std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
          // Guard against copies before the buffer start.
          // Execute any deferred MemCopy since we write to dst here.
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          ClearDeferred(&deferred_src, &deferred_length, safe_source);
          if (SNAPPY_PREDICT_FALSE(delta < 0 ||
                                  !Copy64BytesWithPatternExtension(
                                      op_base + op, len - len_min_offset))) {
            goto break_loop;
          }
          // We aren't deferring this copy so add length right away.
          op += len;
          continue;
        }
        std::ptrdiff_t delta = (op + deferred_length) + len_min_offset - len;
        if (SNAPPY_PREDICT_FALSE(delta < 0)) {
          // Due to the spurious offset in literals have this will trigger
          // at the start of a block when op is still smaller than 256.
          if (tag_type != 0) goto break_loop;
          MemCopy64(op_base + op, deferred_src, deferred_length);
          op += deferred_length;
          DeferMemCopy(&deferred_src, &deferred_length, old_ip, len);
          continue;
        }

        // For copies we need to copy from op_base + delta, for literals
        // we need to copy from ip instead of from the stream.
        const void* from =
            tag_type ? reinterpret_cast<void*>(op_base + delta) : old_ip;
        MemCopy64(op_base + op, deferred_src, deferred_length);
        op += deferred_length;
        DeferMemCopy(&deferred_src, &deferred_length, from, len);
      }
    } while (ip < ip_limit_min_slop &&
             static_cast<ptrdiff_t>(op + deferred_length) < op_limit_min_slop);
  exit:
    ip--;
    assert(ip <= ip_limit);
  }
  // If we deferred a copy then we can perform.  If we are up to date then we
  // might not have enough slop bytes and could run past the end.
  if (deferred_length) {
    MemCopy64(op_base + op, deferred_src, deferred_length);
    op += deferred_length;
    ClearDeferred(&deferred_src, &deferred_length, safe_source);
  }
  return {ip, op};
}